

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool tinyexr::miniz::tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_bool mVar1;
  int in_ESI;
  tdefl_compressor *in_RDI;
  tdefl_compressor *unaff_retaddr;
  tdefl_compressor *in_stack_000002e0;
  
  if (in_ESI == 0) {
    tdefl_start_dynamic_block(in_stack_000002e0);
  }
  else {
    tdefl_start_static_block(unaff_retaddr);
  }
  mVar1 = tdefl_compress_lz_codes(in_RDI);
  return mVar1;
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}